

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O3

ion_status_t sl_insert(ion_skiplist_t *skiplist,ion_key_t key,ion_value_t value)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  ion_sl_level_t iVar4;
  sl_node *__ptr;
  ion_key_t __dest;
  void *__dest_00;
  ion_sl_node_t *piVar5;
  sl_node **ppsVar6;
  sl_node *psVar7;
  ion_status_t iVar8;
  sl_node *psVar12;
  sl_node ***pppsVar13;
  size_t __size;
  long lVar14;
  ion_status_t iVar9;
  ion_status_t iVar10;
  ion_status_t iVar11;
  
  iVar1 = (skiplist->super).record.key_size;
  __size = (size_t)(skiplist->super).record.value_size;
  __ptr = (sl_node *)malloc(0x20);
  if (__ptr == (sl_node *)0x0) {
    iVar11.error = '\x06';
    iVar11._1_3_ = 0;
    iVar11.count = 0;
    return iVar11;
  }
  __dest = malloc((long)iVar1);
  __ptr->key = __dest;
  if (__dest != (void *)0x0) {
    __dest_00 = malloc(__size);
    __ptr->value = __dest_00;
    if (__dest_00 != (void *)0x0) {
      memcpy(__dest,key,(long)iVar1);
      memcpy(__dest_00,value,__size);
      piVar5 = sl_find_node(skiplist,key);
      if ((piVar5->key == (ion_key_t)0x0) ||
         (cVar3 = (*(skiplist->super).compare)(piVar5->key,key,iVar1), cVar3 != '\0')) {
        iVar4 = sl_gen_level(skiplist);
        __ptr->height = iVar4;
        ppsVar6 = (sl_node **)malloc((long)iVar4 * 8 + 8);
        __ptr->next = ppsVar6;
        if (ppsVar6 != (sl_node **)0x0) {
          piVar5 = skiplist->head;
          lVar14 = (long)piVar5->height;
          if (-1 < lVar14) {
            do {
              pppsVar13 = &piVar5->next;
              psVar7 = piVar5->next[lVar14];
              if (psVar7 != (sl_node *)0x0) {
                do {
                  cVar3 = (*(skiplist->super).compare)(key,psVar7->key,iVar1);
                  if (cVar3 < '\0') break;
                  piVar5 = (*pppsVar13)[lVar14];
                  pppsVar13 = &piVar5->next;
                  psVar7 = piVar5->next[lVar14];
                } while (psVar7 != (sl_node *)0x0);
                iVar4 = __ptr->height;
              }
              if (lVar14 <= iVar4) {
                __ptr->next[lVar14] = (*pppsVar13)[lVar14];
                (*pppsVar13)[lVar14] = __ptr;
              }
              bVar2 = 0 < lVar14;
              lVar14 = lVar14 + -1;
            } while (bVar2);
          }
          iVar10.error = '\0';
          iVar10._1_3_ = 0;
          iVar10.count = 1;
          return iVar10;
        }
      }
      else {
        __ptr->height = 0;
        ppsVar6 = (sl_node **)malloc(8);
        __ptr->next = ppsVar6;
        if (ppsVar6 != (sl_node **)0x0) {
          pppsVar13 = &piVar5->next;
          psVar7 = *piVar5->next;
          psVar12 = (sl_node *)0x0;
          if (psVar7 != (sl_node *)0x0) {
            do {
              cVar3 = (*(skiplist->super).compare)(psVar7->key,key,iVar1);
              psVar12 = **pppsVar13;
              if (cVar3 != '\0') break;
              pppsVar13 = &psVar12->next;
              psVar7 = *psVar12->next;
              psVar12 = (sl_node *)0x0;
            } while (psVar7 != (sl_node *)0x0);
            ppsVar6 = __ptr->next;
          }
          *ppsVar6 = psVar12;
          **pppsVar13 = __ptr;
          iVar9.error = '\0';
          iVar9._1_3_ = 0;
          iVar9.count = 1;
          return iVar9;
        }
      }
      free(__ptr->value);
      __dest = __ptr->key;
    }
    free(__dest);
  }
  free(__ptr);
  iVar8.error = '\x06';
  iVar8._1_3_ = 0;
  iVar8.count = 0;
  return iVar8;
}

Assistant:

ion_status_t
sl_insert(
	ion_skiplist_t	*skiplist,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_key_size_t		key_size	= skiplist->super.record.key_size;
	ion_value_size_t	value_size	= skiplist->super.record.value_size;

	ion_sl_node_t *newnode			= malloc(sizeof(ion_sl_node_t));

	if (NULL == newnode) {
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	newnode->key = malloc((size_t) key_size);

	if (NULL == newnode->key) {
		free(newnode);
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	newnode->value = malloc((size_t) value_size);

	if (NULL == newnode->value) {
		free(newnode->key);
		free(newnode);
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	memcpy(newnode->key, key, key_size);
	memcpy(newnode->value, value, value_size);

	/* First we check if there's already a duplicate node. If there is, we're
	   going to do a modified insert instead. */
	ion_sl_node_t *duplicate = sl_find_node(skiplist, key);

	if ((NULL != duplicate->key) && (skiplist->super.compare(duplicate->key, key, key_size) == 0)) {
		/* Child duplicate nodes have no height (which is effectively 1). */
		newnode->height = 0;
		newnode->next	= malloc(sizeof(ion_sl_node_t *) * (newnode->height + 1));

		if (NULL == newnode->next) {
			free(newnode->value);
			free(newnode->key);
			free(newnode);
			return ION_STATUS_ERROR(err_out_of_memory);
		}

		/* We want duplicate to be the last node in the block of duplicate
		 * nodes, so we traverse along the bottom until we get there.
		*/
		while (NULL != duplicate->next[0] && skiplist->super.compare(duplicate->next[0]->key, key, key_size) == 0) {
			duplicate = duplicate->next[0];
		}

		/* Only one height to worry about */
		newnode->next[0]	= duplicate->next[0];
		duplicate->next[0]	= newnode;
	}
	else {
		/* If there's no duplicate node, we do a vanilla insert instead */
		newnode->height = sl_gen_level(skiplist);
		newnode->next	= malloc(sizeof(ion_sl_node_t *) * (newnode->height + 1));

		if (NULL == newnode->next) {
			free(newnode->value);
			free(newnode->key);
			free(newnode);
			return ION_STATUS_ERROR(err_out_of_memory);
		}

		ion_sl_node_t	*cursor = skiplist->head;
		ion_sl_level_t	h;

		for (h = skiplist->head->height; h >= 0; --h) {
			/* The memcmp will return -1 if key is smaller, 0 if equal, 1 if greater. */
			while (NULL != cursor->next[h] && skiplist->super.compare(key, cursor->next[h]->key, key_size) >= 0) {
				cursor = cursor->next[h];
			}

			if (h <= newnode->height) {
				newnode->next[h]	= cursor->next[h];
				cursor->next[h]		= newnode;
			}
		}
	}

	return ION_STATUS_OK(1);
}